

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O3

QcSocket * qc_socket_create(int family,int type,int protocol)

{
  int iVar1;
  QcSocket *pQVar2;
  int *__ptr;
  
  __ptr = (int *)0x4;
  pQVar2 = (QcSocket *)malloc(4);
  if (pQVar2 != (QcSocket *)0x0) {
    iVar1 = socket(family,type,protocol);
    pQVar2->sockfd = iVar1;
    if (iVar1 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x42,"socket create failed");
      free(pQVar2);
      pQVar2 = (QcSocket *)0x0;
    }
    return pQVar2;
  }
  qc_socket_create_cold_1();
  if (__ptr != (int *)0x0) {
    iVar1 = close(*__ptr);
    if (iVar1 == 0) {
      free(__ptr);
      pQVar2 = (QcSocket *)0x0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x51,"socket destroy failed");
      pQVar2 = (QcSocket *)0xffffffff;
    }
    return pQVar2;
  }
  qc_socket_close_cold_1();
  return (QcSocket *)(ulong)(__ptr != (int *)0x0);
}

Assistant:

QcSocket* qc_socket_create(int family, int type, int protocol)
{
    QcSocket *sock;

    qc_malloc(sock, sizeof(QcSocket));

    sock->sockfd = (int)socket(family, type, protocol);
    if(sock->sockfd < 0)
    {
        qc_error("socket create failed");
        qc_free(sock);
        return NULL;
    }

    return sock;
}